

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O3

int picklock(void)

{
  byte bVar1;
  obj *obj;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  _func_int *p_Var5;
  code *pcVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  if (xlock_1 == (obj *)0x0) {
    if (xlock_0 != level->locations[(long)picklock_dx + (long)u.ux] + (long)picklock_dy + (long)u.uy
       ) {
      xlock_4 = 0;
      return 0;
    }
    uVar3 = *(uint *)&xlock_0->field_0x6 >> 4 & 0x1f;
    if (uVar3 == 2) {
      pcVar4 = "You cannot lock an open door.";
    }
    else if (uVar3 == 1) {
      pcVar4 = "This door is broken.";
    }
    else {
      if (uVar3 != 0) goto LAB_001b5584;
      pcVar4 = "This doorway has no door.";
    }
    pline(pcVar4);
  }
  else {
    if ((xlock_1->ox != u.ux) || (xlock_1->oy != u.uy)) {
      if (xlock_1->otyp != 0xdc) {
        xlock_4 = 0;
        return 0;
      }
      iVar7 = (int)xlock_1->oy - (int)u.uy;
      bVar1 = (byte)iVar7;
      bVar9 = -bVar1;
      if (0 < iVar7) {
        bVar9 = bVar1;
      }
      if (1 < bVar9) {
        xlock_4 = 0;
        return 0;
      }
      uVar2 = (int)xlock_1->ox - (int)u.ux;
      uVar3 = -uVar2;
      if (0 < (int)uVar2) {
        uVar3 = uVar2;
      }
      if (1 < uVar3) {
        xlock_4 = 0;
        return 0;
      }
    }
LAB_001b5584:
    if ((xlock_4 < 0x32) && (((youmonst.data)->mflags1 & 0x2000) == 0)) {
      xlock_4 = xlock_4 + 1;
      uVar3 = mt_random();
      if (xlock_3 <= (int)(uVar3 % 100)) {
        return 1;
      }
      lock_action();
      pline("You succeed in %s.");
      obj = xlock_1;
      if (xlock_0 == (rm *)0x0) {
        uVar3 = *(uint *)&xlock_1->field_0x4a;
        *(uint *)&xlock_1->field_0x4a = uVar3 ^ 0x2000;
        if ((short)uVar3 < 0) {
          chest_trap(obj,3,'\0');
        }
        else if (((uVar3 >> 0xd & 1) != 0) && (xlock_5 != '\0')) {
          use_container(obj,0);
        }
      }
      else {
        uVar3 = *(uint *)&xlock_0->field_0x6;
        if ((uVar3 >> 8 & 1) == 0) {
          if ((char)uVar3 < '\0') {
            uVar3 = uVar3 & 0xfffffe0f | 0x40;
          }
          else {
            uVar3 = uVar3 & 0xfffffe0f | 0x80;
          }
          *(uint *)&xlock_0->field_0x6 = uVar3;
        }
        else {
          b_trapped("door",3);
          *(uint *)&xlock_0->field_0x6 = *(uint *)&xlock_0->field_0x6 & 0xfffffe0f;
          unblock_point((int)picklock_dx + (int)u.ux,(int)picklock_dy + (int)u.uy);
          pcVar4 = in_rooms(level,picklock_dx + u.ux,picklock_dy + u.uy,0x12);
          if (*pcVar4 != '\0') {
            add_damage(picklock_dx + u.ux,picklock_dy + u.uy,0);
          }
          newsym((int)picklock_dx + (int)u.ux,(int)picklock_dy + (int)u.uy);
        }
        lVar12 = 1;
        lVar10 = 0x13c;
        p_Var5 = occupation;
        do {
          lVar8 = 0;
          pcVar6 = p_Var5;
          lVar11 = lVar10;
          do {
            if ((pcVar6 == picklock) &&
               (pcVar6 = picklock, (rm *)(level->levname + lVar11) == xlock_0)) {
              magic_map_background((xchar)lVar12,(xchar)lVar8,1);
              p_Var5 = occupation;
              pcVar6 = occupation;
            }
            lVar8 = lVar8 + 1;
            lVar11 = lVar11 + 0xc;
          } while (lVar8 != 0x15);
          lVar12 = lVar12 + 1;
          lVar10 = lVar10 + 0xfc;
        } while (lVar12 != 0x50);
      }
    }
    else {
      xlock_4 = xlock_4 + 1;
      pcVar4 = lock_action();
      pline("You give up your attempt at %s.",pcVar4);
    }
    exercise(3,'\x01');
  }
  xlock_4 = 0;
  return 0;
}

Assistant:

static int picklock(void)
{
	xchar x, y;
	if (xlock.box) {
	    if (((xlock.box->ox != u.ux) || (xlock.box->oy != u.uy)) &&
		    (xlock.box->otyp != IRON_SAFE || abs(xlock.box->oy - u.uy) > 1 ||
		     abs(xlock.box->ox - u.ux) > 1)) {
		return (xlock.usedtime = 0);		/* you or it moved */
	    }
	} else {		/* door */
	    if (xlock.door != &(level->locations[u.ux+picklock_dx][u.uy+picklock_dy])) {
		return (xlock.usedtime = 0);		/* you moved */
	    }
	    switch (xlock.door->doormask) {
		case D_NODOOR:
		    pline("This doorway has no door.");
		    return (xlock.usedtime = 0);
		case D_ISOPEN:
		    pline("You cannot lock an open door.");
		    return (xlock.usedtime = 0);
		case D_BROKEN:
		    pline("This door is broken.");
		    return (xlock.usedtime = 0);
	    }
	}

	if (xlock.usedtime++ >= 50 || nohands(youmonst.data)) {
	    pline("You give up your attempt at %s.", lock_action());
	    exercise(A_DEX, TRUE);	/* even if you don't succeed */
	    return (xlock.usedtime = 0);
	}

	if (rn2(100) >= xlock.chance) return 1;		/* still busy */

	pline("You succeed in %s.", lock_action());
	if (xlock.door) {
	    if (xlock.door->doormask & D_TRAPPED) {
		    b_trapped("door", FINGER);
		    xlock.door->doormask = D_NODOOR;
		    unblock_point(u.ux+picklock_dx, u.uy+picklock_dy);
		    if (*in_rooms(level, u.ux+picklock_dx, u.uy+picklock_dy, SHOPBASE))
			add_damage(u.ux+picklock_dx, u.uy+picklock_dy, 0L);
		    newsym(u.ux+picklock_dx, u.uy+picklock_dy);
	    } else if (xlock.door->doormask & D_LOCKED)
		xlock.door->doormask = D_CLOSED;
	    else xlock.door->doormask = D_LOCKED;
	    /*
	     * Player now knows the door's open/closed status, and its
	     * locked/unlocked status, and also that it isn't trapped
	     * (it would have exploded otherwise); we haven't recorded
	     * the location of the door being picked, so scan for it.
	     */
	    for (x = 1; x < COLNO; x++) {
		for (y = 0; y < ROWNO; y++) {
		    if (picking_at(x, y))
			magic_map_background(x, y, TRUE);
		}
	    }
	} else {
	    xlock.box->olocked = !xlock.box->olocked;
	    if (xlock.box->otrapped)
		chest_trap(xlock.box, FINGER, FALSE);
	    else if (!xlock.box->olocked && xlock.loot_unlocked)
		use_container(xlock.box, 0);
	}
	exercise(A_DEX, TRUE);
	return (xlock.usedtime = 0);
}